

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall crnlib::dynamic_string::trim(dynamic_string *this)

{
  int iVar1;
  dynamic_string *pdVar2;
  uint local_18;
  uint local_14;
  int e;
  int s;
  dynamic_string *this_local;
  
  local_14 = 0;
  while (((int)local_14 < (int)(uint)this->m_len &&
         (iVar1 = isspace((int)this->m_pStr[(int)local_14]), iVar1 != 0))) {
    local_14 = local_14 + 1;
  }
  local_18 = (uint)this->m_len;
  do {
    local_18 = local_18 - 1;
    if ((int)local_18 <= (int)local_14) break;
    iVar1 = isspace((int)this->m_pStr[(int)local_18]);
  } while (iVar1 != 0);
  pdVar2 = crop(this,local_14,(local_18 - local_14) + 1);
  return pdVar2;
}

Assistant:

dynamic_string& dynamic_string::trim()
    {
        int s, e;
        for (s = 0; s < (int)m_len; s++)
        {
            if (!isspace(m_pStr[s]))
            {
                break;
            }
        }

        for (e = m_len - 1; e > s; e--)
        {
            if (!isspace(m_pStr[e]))
            {
                break;
            }
        }

        return crop(s, e - s + 1);
    }